

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

REStackFrame * __thiscall icu_63::RegexMatcher::resetStack(RegexMatcher *this)

{
  int iVar1;
  UVector64 *this_00;
  UBool UVar2;
  int minimumCapacity;
  REStackFrame *pRVar3;
  
  UVector64::removeAllElements(this->fStack);
  this_00 = this->fStack;
  iVar1 = this->fPattern->fFrameSize;
  minimumCapacity = this_00->count + iVar1;
  if ((minimumCapacity < 0) || (this_00->capacity < minimumCapacity)) {
    UVar2 = UVector64::expandCapacity(this_00,minimumCapacity,&this->fDeferredStatus);
    if (UVar2 == '\0') {
      pRVar3 = (REStackFrame *)0x0;
      goto LAB_0023fb62;
    }
  }
  pRVar3 = (REStackFrame *)(this_00->elements + this_00->count);
  this_00->count = iVar1 + this_00->count;
LAB_0023fb62:
  if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = this->fPattern->fFrameSize;
    if (2 < iVar1) {
      memset(pRVar3->fExtra,0xff,(ulong)(iVar1 - 2) << 3);
    }
  }
  else {
    pRVar3 = (REStackFrame *)0x0;
  }
  return pRVar3;
}

Assistant:

REStackFrame *RegexMatcher::resetStack() {
    // Discard any previous contents of the state save stack, and initialize a
    //  new stack frame with all -1 data.  The -1s are needed for capture group limits,
    //  where they indicate that a group has not yet matched anything.
    fStack->removeAllElements();

    REStackFrame *iFrame = (REStackFrame *)fStack->reserveBlock(fPattern->fFrameSize, fDeferredStatus);
    if(U_FAILURE(fDeferredStatus)) {
        return NULL;
    }

    int32_t i;
    for (i=0; i<fPattern->fFrameSize-RESTACKFRAME_HDRCOUNT; i++) {
        iFrame->fExtra[i] = -1;
    }
    return iFrame;
}